

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidGetPotentialChildren(xmlElementContent *ctree,xmlChar **names,int *len,int max)

{
  xmlChar *pxVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = -1;
  if ((len != (int *)0x0 && (names != (xmlChar **)0x0 && ctree != (xmlElementContent *)0x0)) &&
     (iVar2 = *len, iVar2 < max)) {
    if (ctree->type - XML_ELEMENT_CONTENT_PCDATA < 4) {
      lVar3 = (long)iVar2;
      switch(ctree->type) {
      case XML_ELEMENT_CONTENT_PCDATA:
        if (0 < iVar2) {
          lVar4 = 0;
          do {
            iVar2 = xmlStrEqual((xmlChar *)"#PCDATA",names[lVar4]);
            if (iVar2 != 0) goto LAB_0015d3ad;
            lVar4 = lVar4 + 1;
            iVar2 = *len;
            lVar3 = (long)iVar2;
          } while (lVar4 < lVar3);
        }
        *len = iVar2 + 1;
        names[lVar3] = (xmlChar *)"#PCDATA";
        break;
      case XML_ELEMENT_CONTENT_ELEMENT:
        if (0 < iVar2) {
          lVar4 = 0;
          do {
            iVar2 = xmlStrEqual(ctree->name,names[lVar4]);
            if (iVar2 != 0) goto LAB_0015d3ad;
            lVar4 = lVar4 + 1;
            iVar2 = *len;
            lVar3 = (long)iVar2;
          } while (lVar4 < lVar3);
        }
        pxVar1 = ctree->name;
        *len = iVar2 + 1;
        names[lVar3] = pxVar1;
        break;
      default:
        xmlValidGetPotentialChildren(ctree->c1,names,len,max);
        xmlValidGetPotentialChildren(ctree->c2,names,len,max);
      }
    }
LAB_0015d3ad:
    iVar2 = *len;
  }
  return iVar2;
}

Assistant:

int
xmlValidGetPotentialChildren(xmlElementContent *ctree,
                             const xmlChar **names,
                             int *len, int max) {
    int i;

    if ((ctree == NULL) || (names == NULL) || (len == NULL))
        return(-1);
    if (*len >= max) return(*len);

    switch (ctree->type) {
	case XML_ELEMENT_CONTENT_PCDATA:
	    for (i = 0; i < *len;i++)
		if (xmlStrEqual(BAD_CAST "#PCDATA", names[i])) return(*len);
	    names[(*len)++] = BAD_CAST "#PCDATA";
	    break;
	case XML_ELEMENT_CONTENT_ELEMENT:
	    for (i = 0; i < *len;i++)
		if (xmlStrEqual(ctree->name, names[i])) return(*len);
	    names[(*len)++] = ctree->name;
	    break;
	case XML_ELEMENT_CONTENT_SEQ:
	    xmlValidGetPotentialChildren(ctree->c1, names, len, max);
	    xmlValidGetPotentialChildren(ctree->c2, names, len, max);
	    break;
	case XML_ELEMENT_CONTENT_OR:
	    xmlValidGetPotentialChildren(ctree->c1, names, len, max);
	    xmlValidGetPotentialChildren(ctree->c2, names, len, max);
	    break;
   }

   return(*len);
}